

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

bool __thiscall buffer::push_data(buffer *this,iovec *iov,int cnt,int ignore)

{
  bool bVar1;
  bool bVar2;
  int len;
  int iVar3;
  int iVar4;
  size_t *psVar5;
  
  bVar2 = cnt < 1;
  if (0 < cnt) {
    psVar5 = &iov->iov_len;
    iVar4 = 0;
    iVar3 = 1;
    do {
      len = (int)*psVar5 - ignore;
      if (len != 0 && ignore <= (int)*psVar5) {
        bVar1 = push_data(this,(char *)((long)ignore + (long)((iovec *)(psVar5 + -1))->iov_base),len
                         );
        if (!bVar1) {
          this->end_ = this->end_ + -(long)iVar4;
          return bVar2;
        }
        iVar4 = (iVar4 - ignore) + (int)*psVar5;
      }
      ignore = ignore - (int)*psVar5;
      if (ignore < 1) {
        ignore = 0;
      }
      bVar2 = cnt <= iVar3;
      psVar5 = psVar5 + 2;
      bVar1 = iVar3 != cnt;
      iVar3 = iVar3 + 1;
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

bool buffer::push_data(iovec *iov, int cnt, int ignore)
{
    int pushed = 0;
    for (int i = 0; i < cnt; i++, iov++)
    {
        if (ignore < (int)iov->iov_len)
        {
            if (!push_data((char*)iov->iov_base + ignore, iov->iov_len - ignore))
            {
                end_ -= pushed;
                return false;
            }
            pushed += iov->iov_len - ignore;
        }
        ignore = std::max<int>(0, ignore - iov->iov_len);
    }
    return true;
}